

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SystemTimingCheckSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SystemTimingCheckSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *local_90;
  SyntaxNode *local_80;
  size_t index_local;
  SystemTimingCheckSyntax *this_local;
  
  switch(index) {
  case 0:
    local_80 = (SyntaxNode *)0x0;
    if (this != (SystemTimingCheckSyntax *)0xfffffffffffffff0) {
      local_80 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 1:
    token.kind = (this->name).kind;
    token._2_1_ = (this->name).field_0x2;
    token.numFlags.raw = (this->name).numFlags.raw;
    token.rawLen = (this->name).rawLen;
    token.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    local_90 = (SyntaxNode *)0x0;
    if (this != (SystemTimingCheckSyntax *)0xffffffffffffffa0) {
      local_90 = &(this->args).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 4:
    token_01.kind = (this->closeParen).kind;
    token_01._2_1_ = (this->closeParen).field_0x2;
    token_01.numFlags.raw = (this->closeParen).numFlags.raw;
    token_01.rawLen = (this->closeParen).rawLen;
    token_01.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    token_02.kind = (this->semi).kind;
    token_02._2_1_ = (this->semi).field_0x2;
    token_02.numFlags.raw = (this->semi).numFlags.raw;
    token_02.rawLen = (this->semi).rawLen;
    token_02.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SystemTimingCheckSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return name;
        case 2: return openParen;
        case 3: return &args;
        case 4: return closeParen;
        case 5: return semi;
        default: return nullptr;
    }
}